

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rbuSaveState(sqlite3rbu *p,int eStage)

{
  sqlite3 *db;
  sqlite3_stmt *pStmt;
  int iVar1;
  rbu_file **pprVar2;
  char *zSql;
  sqlite3_stmt *pInsert;
  
  if ((p->rc == 0x65) || (p->rc == 0)) {
    pInsert = (sqlite3_stmt *)0x0;
    pprVar2 = &p->pTargetFd;
    if (p->zTarget == (char *)0x0) {
      pprVar2 = &p->pRbuFd;
    }
    db = p->dbRbu;
    zSql = sqlite3_mprintf("INSERT OR REPLACE INTO %s.rbu_state(k, v) VALUES (%d, %d), (%d, %Q), (%d, %Q), (%d, %d), (%d, %d), (%d, %lld), (%d, %lld), (%d, %lld), (%d, %lld), (%d, %Q)  "
                           ,p->zStateDb,1,eStage,2,(p->objiter).zTbl,3,(p->objiter).zIdx,4,
                           (ulong)(uint)p->nStep,5,(ulong)(uint)p->nProgress,6,p->iWalCksum,7,
                           (ulong)(*pprVar2)->iCookie,8,p->iOalSz,9,p->nPhaseOneStep,10,
                           (p->objiter).zDataTbl);
    iVar1 = prepareFreeAndCollectError(db,&pInsert,&p->zErrmsg,zSql);
    pStmt = pInsert;
    if (iVar1 == 0) {
      sqlite3_step(pInsert);
      iVar1 = sqlite3_finalize(pStmt);
      if (iVar1 == 0) {
        return;
      }
    }
    p->rc = iVar1;
  }
  return;
}

Assistant:

static void rbuSaveState(sqlite3rbu *p, int eStage){
  if( p->rc==SQLITE_OK || p->rc==SQLITE_DONE ){
    sqlite3_stmt *pInsert = 0;
    rbu_file *pFd = (rbuIsVacuum(p) ? p->pRbuFd : p->pTargetFd);
    int rc;

    assert( p->zErrmsg==0 );
    rc = prepareFreeAndCollectError(p->dbRbu, &pInsert, &p->zErrmsg, 
        sqlite3_mprintf(
          "INSERT OR REPLACE INTO %s.rbu_state(k, v) VALUES "
          "(%d, %d), "
          "(%d, %Q), "
          "(%d, %Q), "
          "(%d, %d), "
          "(%d, %d), "
          "(%d, %lld), "
          "(%d, %lld), "
          "(%d, %lld), "
          "(%d, %lld), "
          "(%d, %Q)  ",
          p->zStateDb,
          RBU_STATE_STAGE, eStage,
          RBU_STATE_TBL, p->objiter.zTbl, 
          RBU_STATE_IDX, p->objiter.zIdx, 
          RBU_STATE_ROW, p->nStep, 
          RBU_STATE_PROGRESS, p->nProgress,
          RBU_STATE_CKPT, p->iWalCksum,
          RBU_STATE_COOKIE, (i64)pFd->iCookie,
          RBU_STATE_OALSZ, p->iOalSz,
          RBU_STATE_PHASEONESTEP, p->nPhaseOneStep,
          RBU_STATE_DATATBL, p->objiter.zDataTbl
      )
    );
    assert( pInsert==0 || rc==SQLITE_OK );

    if( rc==SQLITE_OK ){
      sqlite3_step(pInsert);
      rc = sqlite3_finalize(pInsert);
    }
    if( rc!=SQLITE_OK ) p->rc = rc;
  }
}